

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O3

void DecideOverLiteralContextModeling
               (uint8_t *input,size_t start_pos,size_t length,size_t mask,int quality,
               size_t size_hint,size_t *num_literal_contexts,uint32_t **literal_context_map,
               uint32_t *arena)

{
  int *piVar1;
  byte bVar2;
  byte bVar4;
  uint uVar5;
  uint32_t uVar6;
  undefined1 auVar7 [16];
  int iVar8;
  long lVar9;
  uint *puVar10;
  uint *puVar11;
  undefined1 *puVar12;
  ulong uVar13;
  uint uVar14;
  uint32_t *puVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  uint uVar21;
  int iVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  uint32_t monogram_histo [3];
  uint32_t two_prefix_histo [6];
  double local_e0;
  undefined1 local_d8 [16];
  double local_c8;
  uint local_a8 [4];
  undefined1 local_98 [16];
  uint8_t *local_88;
  ulong local_80;
  size_t local_78;
  ulong local_70;
  long local_68;
  int local_5c;
  uint local_58 [6];
  size_t local_40;
  double local_38;
  byte bVar3;
  
  if (length < 0x40 || quality < 5) {
    return;
  }
  uVar13 = length + start_pos;
  local_5c = quality;
  if (size_hint < 0x100000) {
    uVar19 = start_pos + 0x40;
  }
  else {
    uVar14 = 0;
    local_88 = input;
    switchD_00569a20::default(arena,0,0x700);
    local_78 = start_pos;
    uVar19 = start_pos + 0x40;
    local_d8 = ZEXT816(0);
    local_38 = 0.0;
    local_70 = uVar13;
    local_80 = uVar19;
    if (uVar19 <= uVar13) {
      do {
        if (start_pos + 2 < uVar19) {
          lVar9 = 2;
          bVar4 = local_88[start_pos + 1 & mask];
          bVar2 = local_88[start_pos & mask];
          do {
            bVar3 = bVar4;
            bVar4 = local_88[start_pos + lVar9 & mask];
            uVar5 = *(uint *)(ShouldUseComplexStaticContextMap(unsigned_char_const*,unsigned_long,unsigned_long,unsigned_long,int,unsigned_long,unsigned_long*,unsigned_int_const**,unsigned_int*)
                              ::kStaticContextMapComplexUTF8 +
                             (ulong)(byte)((&DAT_013f9c30)[bVar2] | (&DAT_013f9b30)[bVar3]) * 4);
            uVar21 = (uint)(bVar4 >> 3);
            arena[uVar21] = arena[uVar21] + 1;
            arena[(ulong)((uVar5 & 0xff) << 5 | uVar21) + 0x20] =
                 arena[(ulong)((uVar5 & 0xff) << 5 | uVar21) + 0x20] + 1;
            lVar9 = lVar9 + 1;
            bVar2 = bVar3;
          } while (lVar9 != 0x40);
          uVar14 = uVar14 + 0x3e;
        }
        start_pos = start_pos + 0x1000;
        uVar19 = uVar19 + 0x1000;
      } while (uVar19 <= uVar13);
      local_38 = (double)uVar14;
    }
    local_40 = mask;
    uVar19 = 0xfffffffffffffff8;
    uVar13 = 0;
    do {
      uVar17 = (ulong)*(uint *)((long)arena + uVar19 + 8);
      if (uVar17 < 0x100) {
        uVar34 = (undefined4)(&duckdb_brotli::kBrotliLog2Table)[uVar17];
        uVar35 = (undefined4)((ulong)(&duckdb_brotli::kBrotliLog2Table)[uVar17] >> 0x20);
      }
      else {
        dVar25 = log2((double)uVar17);
        uVar34 = SUB84(dVar25,0);
        uVar35 = (undefined4)((ulong)dVar25 >> 0x20);
      }
      uVar18 = (ulong)*(uint *)((long)arena + uVar19 + 0xc);
      if (uVar18 < 0x100) {
        dVar25 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar18];
      }
      else {
        dVar25 = log2((double)uVar18);
      }
      uVar36 = local_d8._8_4_;
      uVar37 = local_d8._12_4_;
      uVar13 = uVar13 + uVar17 + uVar18;
      local_d8._0_8_ =
           (local_d8._0_8_ - (double)uVar17 * (double)CONCAT44(uVar35,uVar34)) -
           (double)uVar18 * dVar25;
      local_d8._8_4_ = uVar36;
      local_d8._12_4_ = uVar37;
      uVar19 = uVar19 + 8;
    } while (uVar19 < 0x78);
    if (uVar13 != 0) {
      auVar28._8_4_ = (int)(uVar13 >> 0x20);
      auVar28._0_8_ = uVar13;
      auVar28._12_4_ = 0x45300000;
      dVar25 = (auVar28._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
      if (uVar13 < 0x100) {
        dVar24 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar13];
      }
      else {
        dVar24 = log2(dVar25);
      }
      local_d8._0_8_ = (double)local_d8._0_8_ + dVar25 * dVar24;
    }
    puVar15 = arena + 0x21;
    dVar25 = 0.0;
    lVar9 = 0;
    do {
      local_68 = lVar9;
      uVar19 = 0xfffffffffffffff8;
      dVar24 = 0.0;
      uVar13 = 0;
      do {
        uVar17 = (ulong)*(uint *)((long)puVar15 + uVar19 + 4);
        if (uVar17 < 0x100) {
          dVar26 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar17];
        }
        else {
          dVar26 = log2((double)uVar17);
        }
        uVar18 = (ulong)*(uint *)((long)puVar15 + uVar19 + 8);
        dVar27 = (double)uVar18;
        if (uVar18 < 0x100) {
          dVar23 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar18];
        }
        else {
          local_98._0_8_ = dVar27;
          dVar23 = log2(dVar27);
          dVar27 = (double)local_98._0_8_;
        }
        uVar13 = uVar13 + uVar17 + uVar18;
        dVar24 = (dVar24 - (double)uVar17 * dVar26) - dVar27 * dVar23;
        uVar19 = uVar19 + 8;
      } while (uVar19 < 0x78);
      if (uVar13 != 0) {
        auVar29._8_4_ = (int)(uVar13 >> 0x20);
        auVar29._0_8_ = uVar13;
        auVar29._12_4_ = 0x45300000;
        dVar26 = (auVar29._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
        if (uVar13 < 0x100) {
          dVar27 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar13];
        }
        else {
          dVar27 = log2(dVar26);
        }
        dVar24 = dVar24 + dVar26 * dVar27;
      }
      dVar25 = dVar25 + dVar24;
      lVar9 = local_68 + 1;
      puVar15 = puVar15 + 0x20;
    } while (lVar9 != 0xd);
    dVar25 = dVar25 * (1.0 / local_38);
    uVar13 = local_70;
    start_pos = local_78;
    input = local_88;
    uVar19 = local_80;
    mask = local_40;
    if ((dVar25 <= 3.0) && (0.2 <= (1.0 / local_38) * (double)local_d8._0_8_ - dVar25)) {
      *num_literal_contexts = 0xd;
      puVar12 = ShouldUseComplexStaticContextMap(unsigned_char_const*,unsigned_long,unsigned_long,unsigned_long,int,unsigned_long,unsigned_long*,unsigned_int_const**,unsigned_int*)
                ::kStaticContextMapComplexUTF8;
      goto LAB_010feddc;
    }
  }
  arena[4] = 0;
  arena[5] = 0;
  arena[6] = 0;
  arena[7] = 0;
  arena[0] = 0;
  arena[1] = 0;
  arena[2] = 0;
  arena[3] = 0;
  arena[8] = 0;
  if (uVar19 <= uVar13) {
    lVar9 = uVar19 - start_pos;
    do {
      if (start_pos + 1 < uVar19) {
        iVar22 = DecideOverLiteralContextModeling::lut[input[start_pos & mask] >> 6];
        lVar16 = 1;
        do {
          iVar8 = iVar22 * 3;
          iVar22 = DecideOverLiteralContextModeling::lut[input[start_pos + lVar16 & mask] >> 6];
          arena[iVar8 + iVar22] = arena[iVar8 + iVar22] + 1;
          lVar16 = lVar16 + 1;
        } while (lVar9 != lVar16);
      }
      start_pos = start_pos + 0x1000;
      uVar19 = uVar19 + 0x1000;
    } while (uVar19 <= uVar13);
  }
  puVar11 = local_a8 + 1;
  uVar13 = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar13;
    uVar6 = arena[uVar13];
    piVar1 = (int *)((long)local_a8 +
                    uVar13 * 4 +
                    (SUB168(auVar7 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU) * -3)
    ;
    *piVar1 = *piVar1 + uVar6;
    uVar19 = uVar13;
    if (5 < uVar13) {
      uVar19 = uVar13 - 6;
    }
    local_58[uVar19] = local_58[uVar19] + uVar6;
    uVar13 = uVar13 + 1;
  } while (uVar13 != 9);
  bVar20 = true;
  puVar10 = local_a8;
  dVar25 = 0.0;
  uVar34 = 0;
  uVar35 = 0;
  lVar9 = 0;
  while( true ) {
    uVar13 = (ulong)*puVar10;
    if (uVar13 < 0x100) {
      dVar24 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar13];
    }
    else {
      local_98._8_4_ = uVar34;
      local_98._0_8_ = dVar25;
      local_98._12_4_ = uVar35;
      dVar24 = log2((double)uVar13);
      dVar25 = local_98._0_8_;
      uVar34 = local_98._8_4_;
      uVar35 = local_98._12_4_;
    }
    uVar19 = lVar9 + uVar13;
    dVar25 = dVar25 - (double)uVar13 * dVar24;
    if (!bVar20) break;
    uVar13 = (ulong)*puVar11;
    if (uVar13 < 0x100) {
      dVar24 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar13];
    }
    else {
      local_98._8_4_ = uVar34;
      local_98._0_8_ = dVar25;
      local_98._12_4_ = uVar35;
      dVar24 = log2((double)uVar13);
      dVar25 = local_98._0_8_;
      uVar34 = local_98._8_4_;
      uVar35 = local_98._12_4_;
    }
    lVar9 = uVar19 + uVar13;
    dVar25 = dVar25 - (double)uVar13 * dVar24;
    bVar20 = false;
    puVar10 = local_a8 + 2;
    puVar11 = local_a8 + 3;
  }
  if (uVar19 != 0) {
    auVar30._8_4_ = (int)(uVar19 >> 0x20);
    auVar30._0_8_ = uVar19;
    auVar30._12_4_ = 0x45300000;
    dVar24 = (auVar30._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0);
    if (uVar19 < 0x100) {
      dVar26 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar19];
    }
    else {
      local_98._8_4_ = uVar34;
      local_98._0_8_ = dVar25;
      local_98._12_4_ = uVar35;
      dVar26 = log2(dVar24);
      dVar25 = local_98._0_8_;
      uVar34 = local_98._8_4_;
      uVar35 = local_98._12_4_;
    }
    dVar25 = dVar25 + dVar24 * dVar26;
  }
  local_98._8_4_ = uVar34;
  local_98._0_8_ = dVar25;
  local_98._12_4_ = uVar35;
  bVar20 = true;
  local_c8 = 0.0;
  lVar9 = 0;
  puVar11 = local_58;
  puVar10 = local_58 + 1;
  while( true ) {
    uVar13 = (ulong)*puVar11;
    if (uVar13 < 0x100) {
      dVar25 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar13];
    }
    else {
      dVar25 = log2((double)uVar13);
    }
    uVar19 = lVar9 + uVar13;
    local_c8 = local_c8 - (double)uVar13 * dVar25;
    if (!bVar20) break;
    uVar13 = (ulong)*puVar10;
    if (uVar13 < 0x100) {
      dVar25 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar13];
    }
    else {
      dVar25 = log2((double)uVar13);
    }
    lVar9 = uVar19 + uVar13;
    local_c8 = local_c8 - (double)uVar13 * dVar25;
    bVar20 = false;
    puVar11 = local_58 + 2;
    puVar10 = local_58 + 3;
  }
  if (uVar19 != 0) {
    auVar31._8_4_ = (int)(uVar19 >> 0x20);
    auVar31._0_8_ = uVar19;
    auVar31._12_4_ = 0x45300000;
    dVar25 = (auVar31._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0);
    if (uVar19 < 0x100) {
      dVar24 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar19];
    }
    else {
      dVar24 = log2(dVar25);
    }
    local_c8 = local_c8 + dVar25 * dVar24;
  }
  uVar13 = 0xc;
  dVar25 = 0.0;
  lVar9 = 0;
  while( true ) {
    uVar19 = (ulong)*(uint *)((long)local_58 + uVar13);
    if (uVar19 < 0x100) {
      dVar24 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar19];
    }
    else {
      dVar24 = log2((double)uVar19);
    }
    uVar17 = lVar9 + uVar19;
    dVar25 = dVar25 - (double)uVar19 * dVar24;
    if (0x13 < uVar13) break;
    uVar19 = (ulong)*(uint *)((long)local_58 + uVar13 + 4);
    if (uVar19 < 0x100) {
      dVar24 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar19];
    }
    else {
      dVar24 = log2((double)uVar19);
    }
    lVar9 = uVar17 + uVar19;
    dVar25 = dVar25 - (double)uVar19 * dVar24;
    uVar13 = uVar13 + 8;
  }
  if (uVar17 != 0) {
    auVar32._8_4_ = (int)(uVar17 >> 0x20);
    auVar32._0_8_ = uVar17;
    auVar32._12_4_ = 0x45300000;
    dVar24 = (auVar32._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0);
    if (uVar17 < 0x100) {
      dVar26 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar17];
    }
    else {
      dVar26 = log2(dVar24);
    }
    dVar25 = dVar25 + dVar24 * dVar26;
  }
  local_e0 = 0.0;
  lVar9 = 0;
  do {
    bVar20 = true;
    lVar16 = 0;
    dVar24 = 0.0;
    uVar13 = 0;
    while( true ) {
      uVar19 = (ulong)*(uint *)((long)arena + uVar13 + lVar9 * 0xc);
      if (uVar19 < 0x100) {
        dVar26 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar19];
      }
      else {
        dVar26 = log2((double)uVar19);
      }
      uVar17 = lVar16 + uVar19;
      dVar24 = dVar24 - (double)uVar19 * dVar26;
      if (!bVar20) break;
      uVar13 = (ulong)*(uint *)((long)arena + (uVar13 | 4) + lVar9 * 0xc);
      if (uVar13 < 0x100) {
        dVar26 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar13];
      }
      else {
        dVar26 = log2((double)uVar13);
      }
      lVar16 = uVar17 + uVar13;
      dVar24 = dVar24 - (double)uVar13 * dVar26;
      uVar13 = 8;
      bVar20 = false;
    }
    if (uVar17 != 0) {
      auVar33._8_4_ = (int)(uVar17 >> 0x20);
      auVar33._0_8_ = uVar17;
      auVar33._12_4_ = 0x45300000;
      dVar26 = (auVar33._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0);
      if (uVar17 < 0x100) {
        dVar27 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar17];
      }
      else {
        dVar27 = log2(dVar26);
      }
      dVar24 = dVar24 + dVar26 * dVar27;
    }
    local_e0 = local_e0 + dVar24;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  dVar26 = 1.0 / (double)(local_a8[1] + local_a8[0] + local_a8[2]);
  dVar24 = (double)local_98._0_8_ * dVar26;
  dVar25 = (local_c8 + dVar25) * dVar26;
  if (local_5c < 7) {
    local_e0 = dVar24 * 10.0;
  }
  else {
    local_e0 = local_e0 * dVar26;
  }
  if ((dVar24 - dVar25 < 0.2) && (dVar24 - local_e0 < 0.2)) {
    *num_literal_contexts = 1;
    return;
  }
  if (0.02 <= dVar25 - local_e0) {
    *num_literal_contexts = 3;
    puVar12 = ChooseContextMap(int,unsigned_int*,unsigned_long*,unsigned_int_const**)::
              kStaticContextMapContinuation;
  }
  else {
    *num_literal_contexts = 2;
    puVar12 = ChooseContextMap(int,unsigned_int*,unsigned_long*,unsigned_int_const**)::
              kStaticContextMapSimpleUTF8;
  }
LAB_010feddc:
  *literal_context_map = (uint32_t *)puVar12;
  return;
}

Assistant:

static void DecideOverLiteralContextModeling(const uint8_t* input,
    size_t start_pos, size_t length, size_t mask, int quality, size_t size_hint,
    size_t* num_literal_contexts, const uint32_t** literal_context_map,
    uint32_t* arena) {
  if (quality < MIN_QUALITY_FOR_CONTEXT_MODELING || length < 64) {
    return;
  } else if (ShouldUseComplexStaticContextMap(
      input, start_pos, length, mask, quality, size_hint,
      num_literal_contexts, literal_context_map, arena)) {
    /* Context map was already set, nothing else to do. */
  } else {
    /* Gather bi-gram data of the UTF8 byte prefixes. To make the analysis of
       UTF8 data faster we only examine 64 byte long strides at every 4kB
       intervals. */
    const size_t end_pos = start_pos + length;
    uint32_t* BROTLI_RESTRICT const bigram_prefix_histo = arena;
    memset(bigram_prefix_histo, 0, sizeof(arena[0]) * 9);
    for (; start_pos + 64 <= end_pos; start_pos += 4096) {
      static const int lut[4] = { 0, 0, 1, 2 };
      const size_t stride_end_pos = start_pos + 64;
      int prev = lut[input[start_pos & mask] >> 6] * 3;
      size_t pos;
      for (pos = start_pos + 1; pos < stride_end_pos; ++pos) {
        const uint8_t literal = input[pos & mask];
        ++bigram_prefix_histo[prev + lut[literal >> 6]];
        prev = lut[literal >> 6] * 3;
      }
    }
    ChooseContextMap(quality, &bigram_prefix_histo[0], num_literal_contexts,
                     literal_context_map);
  }
}